

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

pair<double,_double> __thiscall
HPresolve::getBoundsImpliedFree(HPresolve *this,double lowInit,double uppInit,int col,int i,int k)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  double *pdVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  double dVar35;
  double dVar36;
  pair<double,_double> pVar37;
  
  uVar28 = (ulong)i;
  piVar4 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar32 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  uVar23 = uVar32;
  uVar29 = uVar28;
  if ((uVar28 < uVar32) && (uVar31 = (ulong)(i + 1), uVar29 = uVar31, uVar31 < uVar32)) {
    iVar2 = piVar4[uVar28];
    uVar24 = (ulong)iVar2;
    iVar34 = piVar4[uVar31];
    piVar4 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
    piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar33 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    piVar6 = (this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (long)(this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
    pdVar7 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar17 = (long)(this->super_HPreData).colLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
    pdVar8 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (long)(this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
    piVar9 = (this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = (long)(this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2;
    pdVar10 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar20 = (long)(this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
    pdVar11 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar21 = (long)(this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
    uVar28 = (ulong)k;
    pdVar12 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar22 = (long)(this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar12 >> 3;
    pdVar13 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar26 = (long)(this->super_HPreData).ARvalue.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
    iVar27 = iVar34;
    if (iVar34 < iVar2) {
      iVar27 = iVar2;
    }
    uVar25 = uVar24;
    do {
      if ((long)iVar27 == uVar25) {
LAB_00142c22:
        if (iVar34 <= iVar2) goto LAB_00142ed2;
        piVar4 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar21 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
        piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar22 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        piVar6 = (this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar31 = (long)(this->implColLowerRowIndex).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        pdVar7 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = (long)(this->super_HPreData).colLower.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
        pdVar8 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = (long)(this->implColLower).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
        piVar9 = (this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (long)(this->implColUpperRowIndex).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2;
        pdVar10 = (this->super_HPreData).colUpper.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar20 = (long)(this->super_HPreData).colUpper.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
        pdVar11 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar18 = (long)(this->implColUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar11 >> 3;
        pdVar12 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar19 = (long)(this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar12 >> 3;
        pdVar13 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = (long)(this->super_HPreData).ARvalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
        iVar34 = iVar34 - iVar2;
        uVar32 = uVar24;
        goto LAB_00142d3f;
      }
      if (uVar15 <= uVar25) {
        uVar23 = uVar15;
        uVar29 = uVar24;
        if (uVar24 < uVar15) {
          uVar29 = uVar15;
        }
        break;
      }
      iVar3 = piVar4[uVar25];
      uVar29 = (ulong)iVar3;
      uVar23 = uVar33;
      if (uVar33 <= uVar29) break;
      if ((iVar3 != col) && (piVar5[uVar29] != 0)) {
        uVar23 = uVar16;
        if (uVar16 <= uVar29) break;
        uVar23 = uVar17;
        if (piVar6[uVar29] == i) {
          if (uVar17 <= uVar29) break;
LAB_00142b0e:
          pdVar14 = pdVar7;
        }
        else {
          if ((uVar17 <= uVar29) || (uVar23 = uVar18, uVar18 <= uVar29)) break;
          pdVar14 = pdVar8;
          if (pdVar8[uVar29] < pdVar7[uVar29] || pdVar8[uVar29] == pdVar7[uVar29])
          goto LAB_00142b0e;
        }
        uVar23 = uVar19;
        if (uVar19 <= uVar29) break;
        dVar36 = pdVar14[uVar29];
        uVar23 = uVar20;
        if (piVar9[uVar29] == i) {
          if (uVar20 <= uVar29) break;
          pdVar30 = pdVar10 + uVar29;
        }
        else {
          if ((uVar20 <= uVar29) || (uVar23 = uVar21, uVar21 <= uVar29)) break;
          if (pdVar11[uVar29] <= pdVar10[uVar29] && pdVar10[uVar29] != pdVar11[uVar29]) {
            pdVar30 = pdVar11 + uVar29;
          }
          else {
            pdVar30 = pdVar10 + uVar29;
          }
        }
        uVar23 = uVar22;
        uVar29 = uVar28;
        if (uVar22 <= uVar28) break;
        dVar35 = *pdVar30;
        dVar1 = pdVar12[uVar28];
        uVar23 = uVar26;
        uVar29 = uVar25;
        if (0.0 <= dVar1) {
LAB_00142bba:
          if (0.0 < dVar1) {
            if (uVar26 <= uVar25) break;
            if (pdVar13[uVar25] <= 0.0 && pdVar13[uVar25] != 0.0) goto LAB_00142bd2;
          }
          if (dVar35 == 1e+200) goto joined_r0x00142be2;
        }
        else {
          if (uVar26 <= uVar25) break;
          if (pdVar13[uVar25] <= 0.0) goto LAB_00142bba;
LAB_00142bd2:
          dVar35 = dVar36;
          if (dVar36 == -1e+200) {
joined_r0x00142be2:
            if (!NAN(dVar35)) {
              lowInit = -1e+200;
              goto LAB_00142c22;
            }
          }
        }
        if (uVar26 <= uVar25) break;
        lowInit = lowInit - dVar35 * pdVar13[uVar25];
      }
      uVar25 = uVar25 + 1;
      uVar23 = uVar32;
      uVar29 = uVar31;
    } while (uVar31 < uVar32);
  }
LAB_00143000:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar29,
             uVar23);
  while( true ) {
    uVar32 = uVar32 + 1;
    iVar34 = iVar34 + -1;
    if (iVar34 == 0) break;
LAB_00142d3f:
    if (uVar21 <= uVar32) {
      uVar23 = uVar21;
      uVar29 = uVar24;
      if (uVar24 < uVar21) {
        uVar29 = uVar21;
      }
      goto LAB_00143000;
    }
    iVar2 = piVar4[uVar32];
    uVar33 = (ulong)iVar2;
    uVar23 = uVar22;
    uVar29 = uVar33;
    if (uVar22 <= uVar33) goto LAB_00143000;
    if ((iVar2 != col) && (piVar5[uVar33] != 0)) {
      uVar23 = uVar31;
      if (uVar31 <= uVar33) goto LAB_00143000;
      uVar23 = uVar15;
      if (piVar6[uVar33] == i) {
        if (uVar15 <= uVar33) goto LAB_00143000;
        pdVar30 = pdVar7 + uVar33;
      }
      else {
        if ((uVar15 <= uVar33) || (uVar23 = uVar16, uVar16 <= uVar33)) goto LAB_00143000;
        if (pdVar7[uVar33] <= pdVar8[uVar33] && pdVar8[uVar33] != pdVar7[uVar33]) {
          pdVar30 = pdVar8 + uVar33;
        }
        else {
          pdVar30 = pdVar7 + uVar33;
        }
      }
      uVar23 = uVar17;
      if (uVar17 <= uVar33) goto LAB_00143000;
      dVar36 = *pdVar30;
      uVar23 = uVar20;
      if (piVar9[uVar33] == i) {
        if (uVar20 <= uVar33) goto LAB_00143000;
LAB_00142e3c:
        pdVar14 = pdVar10;
      }
      else {
        if ((uVar20 <= uVar33) || (uVar23 = uVar18, uVar18 <= uVar33)) goto LAB_00143000;
        pdVar14 = pdVar11;
        if (pdVar10[uVar33] < pdVar11[uVar33] || pdVar10[uVar33] == pdVar11[uVar33])
        goto LAB_00142e3c;
      }
      uVar23 = uVar19;
      uVar29 = uVar28;
      if (uVar19 <= uVar28) goto LAB_00143000;
      dVar35 = pdVar14[uVar33];
      dVar1 = pdVar12[uVar28];
      uVar23 = uVar26;
      uVar29 = uVar32;
      if (0.0 <= dVar1) {
LAB_00142e82:
        if (0.0 < dVar1) {
          if (uVar26 <= uVar32) goto LAB_00143000;
          if (pdVar13[uVar32] <= 0.0 && pdVar13[uVar32] != 0.0) goto LAB_00142e98;
        }
        if (dVar36 == -1e+200) goto joined_r0x00142ea8;
      }
      else {
        if (uVar26 <= uVar32) goto LAB_00143000;
        if (pdVar13[uVar32] <= 0.0) goto LAB_00142e82;
LAB_00142e98:
        dVar36 = dVar35;
        if (dVar35 == 1e+200) {
joined_r0x00142ea8:
          if (!NAN(dVar36)) {
            uppInit = 1e+200;
            break;
          }
        }
      }
      if (uVar26 <= uVar32) goto LAB_00143000;
      uppInit = uppInit - dVar36 * pdVar13[uVar32];
    }
  }
LAB_00142ed2:
  pVar37.second = uppInit;
  pVar37.first = lowInit;
  return pVar37;
}

Assistant:

pair<double, double> HPresolve::getBoundsImpliedFree(double lowInit, double uppInit,
											const int col, const int i, const int k) {
	double low = lowInit;
	double upp = uppInit;

	//use implied bounds with original bounds
	int j;
	double l,u;
	// if at any stage low becomes  or upp becomes inf break loop  
	// can't use bounds for variables generated by the same row. 
	//low
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
		
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (l==-HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*l;
			else 
				if (u==HSOL_CONST_INF) {
					low = -HSOL_CONST_INF;
					break; }
				else 
					low -= ARvalue.at(kk)*u;
		}
	}
	//upp
	for (int kk = ARstart.at(i); kk<ARstart.at(i+1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col) {
			// check if new bounds are precisely implied bounds from same row
			if (i != implColLowerRowIndex.at(j))
				l = max(colLower.at(j), implColLower.at(j));
			else 
				l = colLower.at(j);
			if (i != implColUpperRowIndex.at(j))
				u = min(colUpper.at(j), implColUpper.at(j));
			else 
				u = colUpper.at(j);
			// if at any stage low becomes  or upp becomes inf it's not implied free 
			//low:: 
			if ((Avalue.at(k)<0 && ARvalue.at(kk)>0) || (Avalue.at(k)>0 && ARvalue.at(kk)<0))
				if (u==HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*u;
			else 
				if (l==-HSOL_CONST_INF) {
					upp = HSOL_CONST_INF;
					break; }
				else 
					upp -= ARvalue.at(kk)*l;
		}
	}
	return make_pair(low, upp);
}